

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined1 *__s;
  code *pcVar5;
  long *plVar6;
  code **ppcVar7;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  code *pcStack_12c0;
  long lStack_12b8;
  long lStack_12b0;
  long alStack_12a8 [13];
  undefined1 auStack_1240 [232];
  long alStack_1158 [64];
  code *pcStack_f58;
  long lStack_f48;
  long lStack_f40;
  undefined1 auStack_f38 [232];
  code *pcStack_e50;
  long lStack_e40;
  long lStack_e38;
  undefined1 auStack_e30 [232];
  undefined1 auStack_d48 [2047];
  undefined1 uStack_549;
  uv_stream_t *puStack_548;
  long lStack_538;
  long lStack_530;
  undefined1 auStack_528 [232];
  uv_stream_t *puStack_440;
  long lStack_430;
  long lStack_428;
  undefined1 auStack_420 [232];
  uv_stream_t *puStack_338;
  long lStack_328;
  long lStack_320;
  undefined1 auStack_318 [232];
  uv_stream_t *puStack_230;
  code *pcStack_228;
  long lStack_220;
  long lStack_218;
  long alStack_210 [29];
  undefined1 auStack_128 [232];
  uv_stream_t *puStack_40;
  long local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_20._0_8_ = nread;
  if (nread < 0) {
    local_30 = -0xfff;
    if (nread == -0xfff) {
      puStack_40 = (uv_stream_t *)0x1afe28;
      puts("got EOF");
      puStack_40 = (uv_stream_t *)0x1afe30;
      free(buf->base);
      uv_close(stream,ponger_on_close);
      return;
    }
  }
  else {
    if (nread != 0) {
      lVar2 = 0;
      do {
        if (buf->base[lVar2] == 'I') {
          buf->base[lVar2] = 'O';
        }
        lVar2 = lVar2 + 1;
      } while (nread != lVar2);
    }
    puStack_40 = (uv_stream_t *)0x1afd9f;
    local_20 = uv_buf_init(buf->base);
    puStack_40 = (uv_stream_t *)0x1afdb3;
    puVar3 = (undefined8 *)malloc(200);
    if (puVar3 == (undefined8 *)0x0) {
      puStack_40 = (uv_stream_t *)0x1afe4b;
      ponger_read_cb_cold_2();
    }
    else {
      *puVar3 = buf->base;
      puStack_40 = (uv_stream_t *)0x1afdde;
      iVar1 = uv_write(puVar3,stream,local_20,1,pinger_after_write);
      local_30 = (long)iVar1;
      local_28 = 0;
      if (local_30 == 0) {
        return;
      }
    }
    puStack_40 = (uv_stream_t *)0x1afe5a;
    ponger_read_cb_cold_1();
  }
  puStack_40 = (uv_stream_t *)0x1afe69;
  ponger_read_cb_cold_3();
  plVar6 = &lStack_220;
  pcStack_228 = (code *)0x1afe79;
  puStack_40 = stream;
  uVar4 = uv_default_loop();
  pcStack_228 = (code *)0x1afe8b;
  iVar1 = uv_pipe_init(uVar4,auStack_128,0);
  alStack_210[0] = (long)iVar1;
  lStack_220 = 0;
  if (alStack_210[0] == 0) {
    pcStack_228 = (code *)0x1afebd;
    iVar1 = uv_pipe_bind(auStack_128,"/tmp/uv-test-sock");
    alStack_210[0] = (long)iVar1;
    lStack_220 = 0;
    if (alStack_210[0] != 0) goto LAB_001b005a;
    pcStack_228 = (code *)0x1afee0;
    uVar4 = uv_default_loop();
    pcStack_228 = (code *)0x1afeef;
    iVar1 = uv_pipe_init(uVar4,alStack_210,0);
    lStack_220 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_220 != 0) goto LAB_001b0067;
    pcStack_228 = (code *)0x1aff1e;
    iVar1 = uv_pipe_bind(alStack_210,"/tmp/uv-test-sock");
    lStack_220 = (long)iVar1;
    lStack_218 = -0x62;
    if (lStack_220 != -0x62) goto LAB_001b0074;
    pcStack_228 = (code *)0x1aff50;
    iVar1 = uv_listen(auStack_128,0x1000,0);
    lStack_220 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_220 != 0) goto LAB_001b0081;
    pcStack_228 = (code *)0x1aff7f;
    iVar1 = uv_listen(alStack_210,0x1000,0);
    lStack_220 = (long)iVar1;
    lStack_218 = -0x16;
    if (lStack_220 != -0x16) goto LAB_001b008e;
    pcVar5 = close_cb;
    pcStack_228 = (code *)0x1affb4;
    uv_close(auStack_128,close_cb);
    pcStack_228 = (code *)0x1affc1;
    uv_close(alStack_210,close_cb);
    pcStack_228 = (code *)0x1affc6;
    uVar4 = uv_default_loop();
    pcStack_228 = (code *)0x1affd0;
    uv_run(uVar4,0);
    lStack_220 = 2;
    lStack_218 = (long)close_cb_called;
    if (lStack_218 != 2) goto LAB_001b009b;
    pcStack_228 = (code *)0x1afff8;
    pcVar5 = (code *)uv_default_loop();
    pcStack_228 = (code *)0x1b000c;
    uv_walk(pcVar5,close_walk_cb,0);
    pcStack_228 = (code *)0x1b0016;
    uv_run(pcVar5,0);
    lStack_220 = 0;
    pcStack_228 = (code *)0x1b0023;
    uVar4 = uv_default_loop();
    pcStack_228 = (code *)0x1b002b;
    iVar1 = uv_loop_close(uVar4);
    lStack_218 = (long)iVar1;
    if (lStack_220 == lStack_218) {
      pcStack_228 = (code *)0x1b0042;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_228 = (code *)0x1b005a;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_001b005a:
    pcStack_228 = (code *)0x1b0067;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_001b0067:
    pcStack_228 = (code *)0x1b0074;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_001b0074:
    pcStack_228 = (code *)0x1b0081;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_001b0081:
    pcStack_228 = (code *)0x1b008e;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_001b008e:
    pcStack_228 = (code *)0x1b009b;
    run_test_pipe_bind_error_addrinuse_cold_6();
    pcVar5 = (code *)stream;
LAB_001b009b:
    pcStack_228 = (code *)0x1b00a8;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_228 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (plVar6 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_230 = (uv_stream_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_338 = (uv_stream_t *)0x1b00d4;
  puStack_230 = (uv_stream_t *)pcVar5;
  uVar4 = uv_default_loop();
  puStack_338 = (uv_stream_t *)0x1b00e3;
  iVar1 = uv_pipe_init(uVar4,auStack_318,0);
  lStack_320 = (long)iVar1;
  lStack_328 = 0;
  if (lStack_320 == 0) {
    puStack_338 = (uv_stream_t *)0x1b0114;
    iVar1 = uv_pipe_bind(auStack_318,"/path/to/unix/socket/that/really/should/not/be/there");
    lStack_320 = (long)iVar1;
    lStack_328 = -0xd;
    if (lStack_320 != -0xd) goto LAB_001b01e0;
    puStack_338 = (uv_stream_t *)0x1b0145;
    uv_close(auStack_318,close_cb);
    puStack_338 = (uv_stream_t *)0x1b014a;
    uVar4 = uv_default_loop();
    puStack_338 = (uv_stream_t *)0x1b0154;
    uv_run(uVar4,0);
    lStack_320 = 1;
    lStack_328 = (long)close_cb_called;
    if (lStack_328 != 1) goto LAB_001b01ef;
    puStack_338 = (uv_stream_t *)0x1b017a;
    pcVar5 = (code *)uv_default_loop();
    puStack_338 = (uv_stream_t *)0x1b018e;
    uv_walk(pcVar5,close_walk_cb,0);
    puStack_338 = (uv_stream_t *)0x1b0198;
    uv_run(pcVar5,0);
    lStack_320 = 0;
    puStack_338 = (uv_stream_t *)0x1b01a6;
    uVar4 = uv_default_loop();
    puStack_338 = (uv_stream_t *)0x1b01ae;
    iVar1 = uv_loop_close(uVar4);
    lStack_328 = (long)iVar1;
    if (lStack_320 == lStack_328) {
      puStack_338 = (uv_stream_t *)0x1b01c6;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_338 = (uv_stream_t *)0x1b01e0;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001b01e0:
    puStack_338 = (uv_stream_t *)0x1b01ef;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001b01ef:
    puStack_338 = (uv_stream_t *)0x1b01fe;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_338 = (uv_stream_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_440 = (uv_stream_t *)0x1b021a;
  puStack_338 = (uv_stream_t *)pcVar5;
  uVar4 = uv_default_loop();
  puStack_440 = (uv_stream_t *)0x1b0229;
  iVar1 = uv_pipe_init(uVar4,auStack_420,0);
  lStack_428 = (long)iVar1;
  lStack_430 = 0;
  if (lStack_428 == 0) {
    puStack_440 = (uv_stream_t *)0x1b025a;
    iVar1 = uv_pipe_bind(auStack_420,"/tmp/uv-test-sock");
    lStack_428 = (long)iVar1;
    lStack_430 = 0;
    if (lStack_428 != 0) goto LAB_001b035b;
    puStack_440 = (uv_stream_t *)0x1b028b;
    iVar1 = uv_pipe_bind(auStack_420,"/tmp/uv-test-sock2");
    lStack_428 = (long)iVar1;
    lStack_430 = -0x16;
    if (lStack_428 != -0x16) goto LAB_001b036a;
    puStack_440 = (uv_stream_t *)0x1b02bc;
    uv_close(auStack_420,close_cb);
    puStack_440 = (uv_stream_t *)0x1b02c1;
    uVar4 = uv_default_loop();
    puStack_440 = (uv_stream_t *)0x1b02cb;
    uv_run(uVar4,0);
    lStack_428 = 1;
    lStack_430 = (long)close_cb_called;
    if (lStack_430 != 1) goto LAB_001b0379;
    puStack_440 = (uv_stream_t *)0x1b02f5;
    pcVar5 = (code *)uv_default_loop();
    puStack_440 = (uv_stream_t *)0x1b0309;
    uv_walk(pcVar5,close_walk_cb,0);
    puStack_440 = (uv_stream_t *)0x1b0313;
    uv_run(pcVar5,0);
    lStack_428 = 0;
    puStack_440 = (uv_stream_t *)0x1b0321;
    uVar4 = uv_default_loop();
    puStack_440 = (uv_stream_t *)0x1b0329;
    iVar1 = uv_loop_close(uVar4);
    lStack_430 = (long)iVar1;
    if (lStack_428 == lStack_430) {
      puStack_440 = (uv_stream_t *)0x1b0341;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_440 = (uv_stream_t *)0x1b035b;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001b035b:
    puStack_440 = (uv_stream_t *)0x1b036a;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001b036a:
    puStack_440 = (uv_stream_t *)0x1b0379;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001b0379:
    puStack_440 = (uv_stream_t *)0x1b0388;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_440 = (uv_stream_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_548 = (uv_stream_t *)0x1b03a4;
  puStack_440 = (uv_stream_t *)pcVar5;
  uVar4 = uv_default_loop();
  puStack_548 = (uv_stream_t *)0x1b03b3;
  iVar1 = uv_pipe_init(uVar4,auStack_528,0);
  lStack_530 = (long)iVar1;
  lStack_538 = 0;
  if (lStack_530 == 0) {
    puStack_548 = (uv_stream_t *)0x1b03e4;
    iVar1 = uv_listen(auStack_528,0x1000,0);
    lStack_530 = (long)iVar1;
    lStack_538 = -0x16;
    if (lStack_530 != -0x16) goto LAB_001b04b0;
    puStack_548 = (uv_stream_t *)0x1b0415;
    uv_close(auStack_528,close_cb);
    puStack_548 = (uv_stream_t *)0x1b041a;
    uVar4 = uv_default_loop();
    puStack_548 = (uv_stream_t *)0x1b0424;
    uv_run(uVar4,0);
    lStack_530 = 1;
    lStack_538 = (long)close_cb_called;
    if (lStack_538 != 1) goto LAB_001b04bf;
    puStack_548 = (uv_stream_t *)0x1b044a;
    pcVar5 = (code *)uv_default_loop();
    puStack_548 = (uv_stream_t *)0x1b045e;
    uv_walk(pcVar5,close_walk_cb,0);
    puStack_548 = (uv_stream_t *)0x1b0468;
    uv_run(pcVar5,0);
    lStack_530 = 0;
    puStack_548 = (uv_stream_t *)0x1b0476;
    uVar4 = uv_default_loop();
    puStack_548 = (uv_stream_t *)0x1b047e;
    iVar1 = uv_loop_close(uVar4);
    lStack_538 = (long)iVar1;
    if (lStack_530 == lStack_538) {
      puStack_548 = (uv_stream_t *)0x1b0496;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_548 = (uv_stream_t *)0x1b04b0;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001b04b0:
    puStack_548 = (uv_stream_t *)0x1b04bf;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001b04bf:
    puStack_548 = (uv_stream_t *)0x1b04ce;
    run_test_pipe_listen_without_bind_cold_3();
  }
  puStack_548 = (uv_stream_t *)run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  __s = auStack_d48;
  pcStack_e50 = (code *)0x1b04ff;
  puStack_548 = (uv_stream_t *)pcVar5;
  memset(__s,0x2e,0x7ff);
  uStack_549 = 0;
  pcStack_e50 = (code *)0x1b050b;
  uVar4 = uv_default_loop();
  pcStack_e50 = (code *)0x1b051a;
  iVar1 = uv_pipe_init(uVar4,auStack_e30,0);
  if (iVar1 == 0) {
    pcStack_e50 = (code *)0x1b0534;
    iVar1 = uv_pipe_bind(auStack_e30,auStack_d48);
    if (iVar1 != -0x24) goto LAB_001b05c7;
    pcStack_e50 = (code *)0x1b054e;
    uv_close(auStack_e30,close_cb);
    pcStack_e50 = (code *)0x1b0553;
    uVar4 = uv_default_loop();
    pcStack_e50 = (code *)0x1b055d;
    uv_run(uVar4,0);
    if (close_cb_called != 1) goto LAB_001b05cc;
    pcStack_e50 = (code *)0x1b056b;
    __s = (undefined1 *)uv_default_loop();
    pcStack_e50 = (code *)0x1b057f;
    uv_walk(__s,close_walk_cb,0);
    pcStack_e50 = (code *)0x1b0589;
    uv_run(__s,0);
    lStack_e38 = 0;
    pcStack_e50 = (code *)0x1b0597;
    uVar4 = uv_default_loop();
    pcStack_e50 = (code *)0x1b059f;
    iVar1 = uv_loop_close(uVar4);
    lStack_e40 = (long)iVar1;
    if (lStack_e38 == lStack_e40) {
      pcStack_e50 = (code *)0x1b05b7;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_e50 = (code *)0x1b05c7;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001b05c7:
    pcStack_e50 = (code *)0x1b05cc;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001b05cc:
    pcStack_e50 = (code *)0x1b05d1;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  pcStack_e50 = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  pcStack_f58 = (code *)0x1b05ed;
  pcStack_e50 = (code *)__s;
  uVar4 = uv_default_loop();
  pcStack_f58 = (code *)0x1b05fc;
  iVar1 = uv_pipe_init(uVar4,auStack_f38,0);
  lStack_f40 = (long)iVar1;
  lStack_f48 = 0;
  if (lStack_f40 == 0) {
    __s = auStack_f38;
    pcStack_f58 = (code *)0x1b062b;
    uv_close(__s,0);
    pcStack_f58 = (code *)0x1b063a;
    iVar1 = uv_pipe_bind(__s,"/tmp/uv-test-sock");
    lStack_f40 = (long)iVar1;
    lStack_f48 = -0x16;
    if (lStack_f40 != -0x16) goto LAB_001b0725;
    pcStack_f58 = (code *)0x1b066b;
    iVar1 = uv_listen(auStack_f38,0x1000,0);
    lStack_f40 = (long)iVar1;
    lStack_f48 = -0x16;
    if (lStack_f40 != -0x16) goto LAB_001b0734;
    pcStack_f58 = (code *)0x1b0690;
    uVar4 = uv_default_loop();
    pcStack_f58 = (code *)0x1b069a;
    iVar1 = uv_run(uVar4,0);
    lStack_f40 = (long)iVar1;
    lStack_f48 = 0;
    if (lStack_f40 != 0) goto LAB_001b0743;
    pcStack_f58 = (code *)0x1b06bf;
    __s = (undefined1 *)uv_default_loop();
    pcStack_f58 = (code *)0x1b06d3;
    uv_walk(__s,close_walk_cb,0);
    pcStack_f58 = (code *)0x1b06dd;
    uv_run(__s,0);
    lStack_f40 = 0;
    pcStack_f58 = (code *)0x1b06eb;
    uVar4 = uv_default_loop();
    pcStack_f58 = (code *)0x1b06f3;
    iVar1 = uv_loop_close(uVar4);
    lStack_f48 = (long)iVar1;
    if (lStack_f40 == lStack_f48) {
      pcStack_f58 = (code *)0x1b070b;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_f58 = (code *)0x1b0725;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b0725:
    pcStack_f58 = (code *)0x1b0734;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b0734:
    pcStack_f58 = (code *)0x1b0743;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b0743:
    pcStack_f58 = (code *)0x1b0752;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_f58 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar6 = &lStack_12b8;
  pcStack_12c0 = (code *)0x1b076e;
  pcStack_f58 = (code *)__s;
  uVar4 = uv_default_loop();
  pcStack_12c0 = (code *)0x1b077d;
  iVar1 = uv_pipe_init(uVar4,auStack_1240,0);
  alStack_1158[0] = (long)iVar1;
  alStack_12a8[0] = 0;
  if (alStack_1158[0] == 0) {
    pcStack_12c0 = (code *)0x1b07bd;
    memset(alStack_1158,0x40,0x200);
    alStack_12a8[0] = -0x24;
    pcStack_12c0 = (code *)0x1b07dd;
    iVar1 = uv_pipe_bind2(auStack_1240,alStack_1158,0x200,1);
    lStack_12b8 = (long)iVar1;
    if (alStack_12a8[0] != lStack_12b8) goto LAB_001b0991;
    lStack_12b8 = -0x24;
    pcStack_12c0 = (code *)0x1b0823;
    iVar1 = uv_pipe_connect2(alStack_12a8,auStack_1240,alStack_1158,0x200,1,abort);
    lStack_12b0 = (long)iVar1;
    if (lStack_12b8 != lStack_12b0) goto LAB_001b099e;
    pcStack_12c0 = (code *)0x1b083e;
    uVar4 = uv_default_loop();
    pcStack_12c0 = (code *)0x1b0848;
    iVar1 = uv_run(uVar4,0);
    lStack_12b8 = (long)iVar1;
    lStack_12b0 = 0;
    if (lStack_12b8 != 0) goto LAB_001b09ab;
    lStack_12b8 = -0x16;
    pcStack_12c0 = (code *)0x1b087f;
    iVar1 = uv_pipe_bind(auStack_1240,"");
    lStack_12b0 = (long)iVar1;
    if (lStack_12b8 != lStack_12b0) goto LAB_001b09b8;
    pcStack_12c0 = (code *)0x1b08b2;
    uv_pipe_connect(alStack_12a8,auStack_1240,"",connect_overlong_cb);
    pcStack_12c0 = (code *)0x1b08b7;
    uVar4 = uv_default_loop();
    pcStack_12c0 = (code *)0x1b08c1;
    iVar1 = uv_run(uVar4,0);
    lStack_12b8 = (long)iVar1;
    lStack_12b0 = 0;
    if (lStack_12b8 != 0) goto LAB_001b09c5;
    lStack_12b8 = 1;
    lStack_12b0 = (long)connect_cb_called;
    if (lStack_12b0 != 1) goto LAB_001b09d2;
    lStack_12b8 = 1;
    lStack_12b0 = (long)close_cb_called;
    if (lStack_12b0 == 1) {
      pcStack_12c0 = (code *)0x1b092a;
      uVar4 = uv_default_loop();
      pcStack_12c0 = (code *)0x1b093e;
      uv_walk(uVar4,close_walk_cb,0);
      pcStack_12c0 = (code *)0x1b0948;
      uv_run(uVar4,0);
      lStack_12b8 = 0;
      pcStack_12c0 = (code *)0x1b0955;
      uVar4 = uv_default_loop();
      pcStack_12c0 = (code *)0x1b095d;
      iVar1 = uv_loop_close(uVar4);
      lStack_12b0 = (long)iVar1;
      if (lStack_12b8 == lStack_12b0) {
        pcStack_12c0 = (code *)0x1b0974;
        uv_library_shutdown();
        return;
      }
      goto LAB_001b09ec;
    }
  }
  else {
    pcStack_12c0 = (code *)0x1b0991;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0991:
    pcStack_12c0 = (code *)0x1b099e;
    run_test_pipe_overlong_path_cold_2();
LAB_001b099e:
    pcStack_12c0 = (code *)0x1b09ab;
    run_test_pipe_overlong_path_cold_3();
LAB_001b09ab:
    pcStack_12c0 = (code *)0x1b09b8;
    run_test_pipe_overlong_path_cold_4();
LAB_001b09b8:
    pcStack_12c0 = (code *)0x1b09c5;
    run_test_pipe_overlong_path_cold_5();
LAB_001b09c5:
    pcStack_12c0 = (code *)0x1b09d2;
    run_test_pipe_overlong_path_cold_6();
LAB_001b09d2:
    pcStack_12c0 = (code *)0x1b09df;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_12c0 = (code *)0x1b09ec;
  run_test_pipe_overlong_path_cold_8();
LAB_001b09ec:
  iVar1 = (int)&lStack_12b0;
  pcStack_12c0 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_12c0 = (code *)(long)iVar1;
  if (pcStack_12c0 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(undefined8 *)((long)plVar6 + 0x50),close_cb);
    return;
  }
  ppcVar7 = &pcStack_12c0;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(ppcVar7,0);
  return;
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = buf->base;
  ASSERT_OK(uv_write(req, stream, &writebuf, 1, pinger_after_write));
}